

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

double median(double *tab_values,int tab_length)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  int n;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  
  iVar2 = 1;
  if (1 < tab_length) {
    iVar2 = tab_length;
  }
  uVar3 = (ulong)(uint)tab_length;
  pdVar5 = tab_values;
  for (uVar4 = 0; uVar6 = 1, uVar4 != iVar2 - 1; uVar4 = uVar4 + 1) {
    for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = tab_values[uVar4];
      if (pdVar5[uVar6] < dVar1) {
        tab_values[uVar4] = pdVar5[uVar6];
        pdVar5[uVar6] = dVar1;
      }
    }
    uVar3 = uVar3 - 1;
    pdVar5 = pdVar5 + 1;
  }
  return tab_values[tab_length / 2];
}

Assistant:

inline double median(double* tab_values, int tab_length)
{
	double temp = 0;
	int i = 0, j = 0;
	int n = tab_length;
	double* x = tab_values;

	// The following two loops sort the array x in ascending order.
	for (i = 0; i < n-1; i++) {
		for (j = i+1; j < n; j++) {
			if (x[j] < x[i]) {
				// Swap elements.
				temp = x[i];
				x[i] = x[j];
				x[j] = temp;
			}
		}
	}

	return x[n/2];
}